

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString * __thiscall
despot::util::tinyxml::TiXmlString::append(TiXmlString *this,char *str,size_type len)

{
  size_type sVar1;
  ulong sz;
  char *__dest;
  size_type newsize;
  size_type len_local;
  char *str_local;
  TiXmlString *this_local;
  
  sVar1 = length(this);
  sz = sVar1 + len;
  sVar1 = capacity(this);
  if (sVar1 < sz) {
    sVar1 = capacity(this);
    reserve(this,sz + sVar1);
  }
  __dest = finish(this);
  memmove(__dest,str,len);
  set_size(this,sz);
  return this;
}

Assistant:

TiXmlString& TiXmlString::append(const char* str, size_type len) {
	size_type newsize = length() + len;
	if (newsize > capacity()) {
		reserve(newsize + capacity());
	}
	memmove(finish(), str, len);
	set_size(newsize);
	return *this;
}